

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::CreateBuffer::exec(CreateBuffer *this,Thread *t)

{
  uint uVar1;
  deUint32 err;
  deBool dVar2;
  MessageBuilder *pMVar3;
  Buffer *pBVar4;
  MessageBuilder local_358;
  MessageBuilder local_1b8;
  uint local_24;
  Thread *pTStack_20;
  GLuint buffer;
  EGLThread *thread;
  Thread *t_local;
  CreateBuffer *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  pTStack_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0)
  ;
  if (pTStack_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  local_24 = 0;
  tcu::ThreadUtil::Thread::newMessage(&local_1b8,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [32])"Begin -- glGenBuffers(1, { 0 })");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b8);
  do {
    (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x6c8))(1,&local_24);
    err = (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"genBuffers(1, &buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4ab);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_358,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_358,(char (*) [26])"End -- glGenBuffers(1, { ");
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&local_24);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2b4b608);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_358);
  uVar1 = local_24;
  pBVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(&this->m_buffer);
  pBVar4->buffer = uVar1;
  return;
}

Assistant:

void CreateBuffer::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint buffer = 0;

	thread.newMessage() << "Begin -- glGenBuffers(1, { 0 })" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, genBuffers(1, &buffer));
	thread.newMessage() << "End -- glGenBuffers(1, { " << buffer << " })" << tcu::ThreadUtil::Message::End;

	m_buffer->buffer = buffer;
}